

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O0

void transition(int64_t k)

{
  value_type pBVar1;
  size_type sVar2;
  reference ppBVar3;
  reference pvVar4;
  undefined8 in_RDI;
  BtorSimState update;
  int64_t in_stack_00000030;
  Btor2Line *state;
  size_t i_1;
  int64_t i;
  BtorSimState *in_stack_ffffffffffffffa8;
  vector<BtorSimState,_std::allocator<BtorSimState>_> *this;
  ulong local_18;
  long local_10;
  
  msg(1,"transition %ld",in_RDI);
  for (local_10 = 0; local_10 < num_format_lines; local_10 = local_10 + 1) {
    delete_current_state(0x130d22);
  }
  if (((print_trace & 1U) != 0) && ((print_states & 1U) != 0)) {
    printf("#%ld\n",in_RDI);
  }
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::size(&states);
    if (sVar2 <= local_18) break;
    ppBVar3 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::operator[](&states,local_18);
    pBVar1 = *ppBVar3;
    this = &next_state;
    std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[](&next_state,pBVar1->id);
    update_current_state((int64_t)this,in_stack_ffffffffffffffa8);
    pvVar4 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[](this,pBVar1->id);
    if (pvVar4->type == BITVEC) {
      pvVar4 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                         (&next_state,pBVar1->id);
      (pvVar4->field_1).bv_state = (BtorSimBitVector *)0x0;
    }
    else if (pvVar4->type == ARRAY) {
      pvVar4 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                         (&next_state,pBVar1->id);
      (pvVar4->field_1).bv_state = (BtorSimBitVector *)0x0;
    }
    else {
      die("Invalid state type");
    }
    if (((print_trace & 1U) != 0) && ((print_states & 1U) != 0)) {
      print_state_or_input(i_1,(int64_t)state,in_stack_00000030,(bool)update.field_1._7_1_);
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

static void
transition (int64_t k)
{
  msg (1, "transition %" PRId64, k);
  for (int64_t i = 0; i < num_format_lines; i++) delete_current_state (i);
  if (print_trace && print_states) printf ("#%" PRId64 "\n", k);
  for (size_t i = 0; i < states.size (); i++)
  {
    Btor2Line *state = states[i];
    assert (0 <= state->id), assert (state->id < num_format_lines);
    BtorSimState update = next_state[state->id];
    assert (update.is_set ());
    update_current_state (state->id, update);
    switch (next_state[state->id].type)
    {
      case BtorSimState::Type::BITVEC:
        next_state[state->id].bv_state = nullptr;
        break;
      case BtorSimState::Type::ARRAY:
        next_state[state->id].array_state = nullptr;
        break;
      default: die ("Invalid state type");
    }
    if (print_trace && print_states)
      print_state_or_input (state->id, i, k, false);
  }
}